

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::projpt2edge(tetgenmesh *this,double *p,double *e1,double *e2,double *prj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = *e1;
  dVar1 = e1[1];
  dVar8 = *e2 - dVar10;
  dVar7 = e2[1] - dVar1;
  dVar2 = e1[2];
  dVar9 = e2[2] - dVar2;
  dVar3 = *p;
  dVar4 = p[1];
  dVar5 = p[2];
  dVar6 = dVar9 * dVar9 + dVar8 * dVar8 + dVar7 * dVar7;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar10 = (dVar5 - dVar2) * (dVar9 / dVar6) +
           (dVar3 - dVar10) * (dVar8 / dVar6) + (dVar4 - dVar1) * (dVar7 / dVar6);
  *prj = (dVar8 / dVar6) * dVar10 + *e1;
  prj[1] = (dVar7 / dVar6) * dVar10 + e1[1];
  prj[2] = dVar10 * (dVar9 / dVar6) + e1[2];
  return;
}

Assistant:

void tetgenmesh::projpt2edge(REAL* p, REAL* e1, REAL* e2, REAL* prj)
{
  REAL v1[3], v2[3];
  REAL len, l_p;

  v1[0] = e2[0] - e1[0];
  v1[1] = e2[1] - e1[1];
  v1[2] = e2[2] - e1[2];
  v2[0] = p[0] - e1[0];
  v2[1] = p[1] - e1[1];
  v2[2] = p[2] - e1[2];

  len = sqrt(dot(v1, v1));
  v1[0] /= len;
  v1[1] /= len;
  v1[2] /= len;
  l_p = dot(v1, v2);

  prj[0] = e1[0] + l_p * v1[0];
  prj[1] = e1[1] + l_p * v1[1];
  prj[2] = e1[2] + l_p * v1[2];
}